

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O3

bool fmt::impl::parse_integer<char,long>(char **format,long *val)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  
  pbVar1 = (byte *)*format;
  bVar3 = *pbVar1;
  if ((byte)(bVar3 - 0x3a) < 0xf6) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      pbVar1 = pbVar1 + 1;
      if (0xccccccccccccccc < lVar2) {
        return false;
      }
      if ((long)((ulong)(bVar3 & 0xf) ^ 0x7fffffffffffffff) < lVar2 * 10) {
        return false;
      }
      *format = (char *)pbVar1;
      lVar2 = lVar2 * 10 + (ulong)(bVar3 & 0xf);
      bVar3 = *pbVar1;
    } while (0xf5 < (byte)(bVar3 - 0x3a));
  }
  *val = lVar2;
  return true;
}

Assistant:

bool parse_integer(const CharT*& format, T& val) {
   T v{};
   CharT ch = *format;
   constexpr T maxval = std::numeric_limits<T>::max();
   constexpr T maxval10 = maxval / 10;
   while (ch >= '0' && ch <= '9') {
      T digit = ch - '0';
      if (v > maxval10) return false;
      v *= 10;
      if (v > maxval - digit) return false;
      v += digit;
      ch = *++format;
   }
   val = v;
   return true;
}